

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsread.c
# Opt level: O0

int32_t conv_code_pdg2phits(int32_t c)

{
  void *pvVar1;
  int iVar2;
  int in_EDI;
  int32_t absphitscode;
  int32_t Z;
  int32_t A;
  int32_t I;
  void *res;
  int key;
  int32_t absc;
  int local_30;
  int local_2c;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_2c = in_EDI;
  if (in_EDI < 0) {
    local_2c = -in_EDI;
  }
  local_c = local_2c;
  local_8 = in_EDI;
  if (local_2c < 0x3b9aca01) {
    local_10 = local_2c;
    pvVar1 = bsearch(&local_10,phits_known_nonion_codes,0x14,4,phits_cmp_codes);
    if ((pvVar1 == (void *)0x0) ||
       ((local_8 < 0 && (((local_8 == -0x16 || (local_8 == -0x6f)) || (local_8 == -0x14b)))))) {
      local_4 = 0;
    }
    else {
      local_4 = local_8;
    }
  }
  else if (local_2c < 0x3c336077) {
    if (in_EDI < 0) {
      local_4 = 0;
    }
    else {
      local_30 = (local_2c / 10) % 1000;
      local_c = (local_2c / 10) / 1000;
      iVar2 = local_c % 1000;
      if (local_c / 1000 != 100) {
        phits_error((char *)0x102734);
      }
      if ((((local_2c % 10 == 0) && (local_30 != 0)) && (iVar2 != 0)) && (iVar2 <= local_30)) {
        local_30 = iVar2 * 1000000 + local_30;
        if (local_8 < 0) {
          local_30 = -local_30;
        }
        local_4 = local_30;
      }
      else {
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int32_t conv_code_pdg2phits( int32_t c )
{
  int32_t absc = c < 0 ? -c : c;
  if ( absc <= 1000000000 ) {
    //Presumably PHITS use pdg codes directly for non-nuclei/ions, but only with
    //room for 6 digits. And in fact, only those in the phits_known_nonion_codes
    //are supported - and for 22, 111, 331 only if not negative (these particles
    //are their own antiparticles):
    int key = absc;
    void * res = bsearch(&key, phits_known_nonion_codes, sizeof(phits_known_nonion_codes) / sizeof(phits_known_nonion_codes[0]),
                         sizeof(phits_known_nonion_codes[0]), phits_cmp_codes);
    if ( !res || ( c < 0 && (c==-22||c==-111||c==-331) ) )
      return 0;
    return c;
  }
  if (absc<=1009999990) {
    //Ions. PDG format for ions is 10LZZZAAAI, where L!=0 indicates strangeness
    //and I!=0 indicates exited nuclei. We only allow L=I=0 ions here.
    if (c<0)
      return 0;//Negative ions seems to not actually be supported in PHITS.
    int32_t I = absc % 10;//isomer level
    absc/=10;
    int32_t A = absc%1000;
    absc/=1000;
    int32_t Z = absc % 1000;
    if ( !(absc/1000==100) ) {
      //L=0 guaranteed by enclosing condition.
      phits_error("pdgcode conversion logic error");
    }
    if ( I || !A || !Z || Z>A )
      return 0;
    //PHITS encode nucleis as Z*1000000+A:
    int32_t absphitscode = Z*1000000+A;
    return c < 0 ? -absphitscode : absphitscode;
  }
  return 0;
}